

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

TypeCast * __thiscall
soul::PoolAllocator::
allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type&,soul::AST::BinaryOperator&>
          (PoolAllocator *this,Context *args,Type *args_1,BinaryOperator *args_2)

{
  Type *c;
  Context *this_00;
  DestructorFn *pDVar1;
  _lambda_void___1_ local_5d [13];
  Type local_50;
  TypeCast *local_38;
  TypeCast *newObject;
  PoolItem *newItem;
  BinaryOperator *args_local_2;
  Type *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_2;
  args_local_2 = (BinaryOperator *)args_1;
  args_local_1 = (Type *)args;
  args_local = (Context *)this;
  newObject = (TypeCast *)allocateSpaceForObject(this,0x50);
  c = args_local_1;
  this_00 = &(newObject->super_Expression).super_Statement.super_ASTObject.context;
  Type::Type(&local_50,(Type *)args_local_2);
  AST::TypeCast::TypeCast((TypeCast *)this_00,(Context *)c,&local_50,(Expression *)newItem);
  Type::~Type(&local_50);
  local_38 = (TypeCast *)this_00;
  pDVar1 = allocate(soul::AST::Context&,soul::Type&,soul::AST::BinaryOperator&)::{lambda(void*)#1}::
           operator_cast_to_function_pointer(local_5d);
  *(DestructorFn **)&(newObject->super_Expression).super_Statement.super_ASTObject.objectType =
       pDVar1;
  return local_38;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }